

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

void soul::ASTUtilities::findAllMainProcessors
               (ModuleBase *module,
               vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
               *found)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ProcessorBase *pPVar4;
  Property *pPVar5;
  Constant *pCVar6;
  undefined8 *extraout_RDX;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::AST::ProcessorBase> pb;
  pool_ref<soul::AST::ProcessorBase> local_50;
  pool_ptr<soul::AST::Constant> local_48;
  pool_ref<soul::AST::ModuleBase> local_40;
  long local_38;
  undefined8 *puVar3;
  
  iVar2 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2); puVar3 != extraout_RDX;
      puVar3 = puVar3 + 1) {
    local_40.object = (ModuleBase *)*puVar3;
    cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_38,&local_40);
    if (local_38 != 0) {
      pPVar4 = pool_ptr<soul::AST::ProcessorBase>::operator->
                         ((pool_ptr<soul::AST::ProcessorBase> *)&local_38);
      pPVar5 = AST::Annotation::findProperty<char[5]>(&pPVar4->annotation,(char (*) [5])"main");
      if (pPVar5 != (Property *)0x0) {
        (*(((pPVar5->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                  (&local_48);
        if (local_48.object != (Constant *)0x0) {
          pCVar6 = pool_ptr<soul::AST::Constant>::operator->(&local_48);
          bVar1 = soul::Value::getAsBool(&pCVar6->value);
          if (bVar1) {
            local_50.object =
                 pool_ptr<soul::AST::ProcessorBase>::operator*
                           ((pool_ptr<soul::AST::ProcessorBase> *)&local_38);
            std::
            vector<soul::pool_ref<soul::AST::ProcessorBase>,std::allocator<soul::pool_ref<soul::AST::ProcessorBase>>>
            ::emplace_back<soul::pool_ref<soul::AST::ProcessorBase>>
                      ((vector<soul::pool_ref<soul::AST::ProcessorBase>,std::allocator<soul::pool_ref<soul::AST::ProcessorBase>>>
                        *)found,&local_50);
          }
        }
      }
    }
    findAllMainProcessors((ModuleBase *)*puVar3,found);
  }
  return;
}

Assistant:

static void findAllMainProcessors (AST::ModuleBase& module, std::vector<pool_ref<AST::ProcessorBase>>& found)
    {
        for (auto& m : module.getSubModules())
        {
            if (auto pb = cast<AST::ProcessorBase> (m))
                if (auto main = pb->annotation.findProperty ("main"))
                    if (auto c = main->value->getAsConstant())
                        if (c->value.getAsBool())
                            found.push_back (*pb);

            findAllMainProcessors (m, found);
        }
    }